

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_ChangeTid(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  AActor *this;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_00431e13;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this != (AActor *)0x0) {
        bVar2 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00431e13;
        }
        goto LAB_00431dd7;
      }
    }
    else if (this != (AActor *)0x0) goto LAB_00431e03;
    this = (AActor *)0x0;
LAB_00431dd7:
    if (numparam == 1) {
      pcVar3 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        iVar1 = param[1].field_0.i;
        AActor::RemoveFromHash(this);
        this->tid = iVar1;
        AActor::AddToHash(this);
        return 0;
      }
      pcVar3 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0xc9e,
                  "int AF_AActor_ChangeTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_00431e03:
  pcVar3 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00431e13:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0xc9d,"int AF_AActor_ChangeTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, ChangeTid)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(tid);
	self->RemoveFromHash();
	self->tid = tid;
	self->AddToHash();
	return 0;
}